

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processDelayedCallbacks(UA_Server *server)

{
  UA_DelayedJob *pUVar1;
  UA_DelayedJob *local_28;
  UA_DelayedJob *curelm;
  UA_DelayedJob *dj_tmp;
  UA_DelayedJob *dj;
  UA_Server *server_local;
  
  dj_tmp = (server->delayedCallbacks).slh_first;
  while (dj_tmp != (UA_DelayedJob *)0x0) {
    pUVar1 = (dj_tmp->next).sle_next;
    if ((server->delayedCallbacks).slh_first == dj_tmp) {
      (server->delayedCallbacks).slh_first = (((server->delayedCallbacks).slh_first)->next).sle_next
      ;
    }
    else {
      for (local_28 = (server->delayedCallbacks).slh_first; (local_28->next).sle_next != dj_tmp;
          local_28 = (local_28->next).sle_next) {
      }
      (local_28->next).sle_next = (((local_28->next).sle_next)->next).sle_next;
    }
    processJob(server,&dj_tmp->job);
    free(dj_tmp);
    dj_tmp = pUVar1;
  }
  return;
}

Assistant:

static void
processDelayedCallbacks(UA_Server *server) {
    UA_DelayedJob *dj, *dj_tmp;
    SLIST_FOREACH_SAFE(dj, &server->delayedCallbacks, next, dj_tmp) {
        SLIST_REMOVE(&server->delayedCallbacks, dj, UA_DelayedJob, next);
        processJob(server, &dj->job);
        UA_free(dj);
    }
}